

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

void __thiscall AAmbientSound::SetTicker(AAmbientSound *this,FAmbientSound *ambient)

{
  int iVar1;
  
  if ((~ambient->type & 3) == 0) {
    this->NextCheck = this->NextCheck + 1;
  }
  else if ((ambient->type & 1) == 0) {
    this->NextCheck = this->NextCheck + ambient->periodmin;
  }
  else {
    iVar1 = rand();
    this->NextCheck =
         ambient->periodmin + this->NextCheck +
         (int)((float)(ambient->periodmax - ambient->periodmin) * (float)iVar1 * 4.656613e-10);
  }
  return;
}

Assistant:

void AAmbientSound::SetTicker (struct FAmbientSound *ambient)
{
	if ((ambient->type & CONTINUOUS) == CONTINUOUS)
	{
		NextCheck += 1;
	}
	else if (ambient->type & RANDOM)
	{
		NextCheck += (int)(((float)rand() / (float)RAND_MAX) *
				(float)(ambient->periodmax - ambient->periodmin)) +
				ambient->periodmin;
	}
	else
	{
		NextCheck += ambient->periodmin;
	}
}